

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

State * LiteScript::State::Load(State *__return_storage_ptr__,istream *stream,Memory *memory)

{
  uint uVar1;
  int iVar2;
  reference pvVar3;
  reference this;
  Namer local_238;
  uint local_1f0;
  uint local_1ec;
  uint sz_4;
  uint i_6;
  uint local_1e0;
  uint local_1dc;
  uint sz_3;
  uint i_5;
  value_type local_1b8;
  uint local_1a8;
  uint local_1a4;
  uint sz_2;
  uint i_4;
  Nullable<LiteScript::Variable> local_180;
  uint local_160;
  uint local_15c;
  uint sz_1;
  uint i_3;
  Nullable<LiteScript::Variable> local_138;
  uint local_118;
  uint local_114;
  uint sz;
  uint i_2;
  value_type local_f0;
  uint local_e0;
  uint local_dc;
  uint sz_j_1;
  uint j_1;
  pointer pVStack_d0;
  pointer local_c8;
  uint local_b8;
  uint local_b4;
  uint sz_i_1;
  uint i_1;
  value_type local_90;
  uint local_80;
  uint local_7c;
  uint sz_j;
  uint j;
  pointer pVStack_70;
  pointer local_68;
  uint local_60;
  uint local_5c;
  uint sz_i;
  uint i;
  allocator<LiteScript::Variable> local_35 [8];
  allocator<LiteScript::Variable> allocator;
  Memory *memory_local;
  istream *stream_local;
  State *state;
  
  State(__return_storage_ptr__,memory);
  uVar1 = IStreamer::Read<unsigned_int>(stream);
  __return_storage_ptr__->instr_index = uVar1;
  uVar1 = IStreamer::Read<unsigned_int>(stream);
  __return_storage_ptr__->line_num = uVar1;
  std::allocator<LiteScript::Variable>::allocator(local_35);
  __gnu_cxx::new_allocator<LiteScript::Variable>::destroy<LiteScript::Variable>
            ((new_allocator<LiteScript::Variable> *)local_35,&__return_storage_ptr__->nsp_global);
  uVar1 = IStreamer::Read<unsigned_int>(stream);
  Memory::GetVariable((Nullable<LiteScript::Variable> *)&sz_i,memory,uVar1);
  __gnu_cxx::new_allocator<LiteScript::Variable>::
  construct<LiteScript::Variable,LiteScript::Nullable<LiteScript::Variable>>
            ((new_allocator<LiteScript::Variable> *)local_35,&__return_storage_ptr__->nsp_global,
             (Nullable<LiteScript::Variable> *)&sz_i);
  Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&sz_i);
  std::
  vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
  ::clear(&__return_storage_ptr__->args_tmp);
  local_5c = 0;
  local_60 = IStreamer::Read<unsigned_int>(stream);
  for (; local_5c < local_60; local_5c = local_5c + 1) {
    _sz_j = (pointer)0x0;
    pVStack_70 = (pointer)0x0;
    local_68 = (pointer)0x0;
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
              ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)&sz_j);
    std::
    vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
    ::push_back(&__return_storage_ptr__->args_tmp,
                (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)&sz_j);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
              ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)&sz_j);
    local_7c = 0;
    local_80 = IStreamer::Read<unsigned_int>(stream);
    for (; local_7c < local_80; local_7c = local_7c + 1) {
      pvVar3 = std::
               vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ::operator[](&__return_storage_ptr__->args_tmp,(ulong)local_5c);
      uVar1 = IStreamer::Read<unsigned_int>(stream);
      Memory::GetVariable((Nullable<LiteScript::Variable> *)&sz_i_1,memory,uVar1);
      Nullable::operator_cast_to_Variable((Nullable *)&local_90);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
                (pvVar3,&local_90);
      Variable::~Variable(&local_90);
      Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&sz_i_1);
    }
  }
  std::
  vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
  ::clear(&__return_storage_ptr__->args_tmp);
  local_b4 = 0;
  local_b8 = IStreamer::Read<unsigned_int>(stream);
  for (; local_b4 < local_b8; local_b4 = local_b4 + 1) {
    _sz_j_1 = (pointer)0x0;
    pVStack_d0 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
              ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)&sz_j_1);
    std::
    vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
    ::push_back(&__return_storage_ptr__->args_def,
                (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)&sz_j_1);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
              ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)&sz_j_1);
    local_dc = 0;
    local_e0 = IStreamer::Read<unsigned_int>(stream);
    for (; local_dc < local_e0; local_dc = local_dc + 1) {
      pvVar3 = std::
               vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ::operator[](&__return_storage_ptr__->args_def,(ulong)local_b4);
      uVar1 = IStreamer::Read<unsigned_int>(stream);
      Memory::GetVariable((Nullable<LiteScript::Variable> *)&sz,memory,uVar1);
      Nullable::operator_cast_to_Variable((Nullable *)&local_f0);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
                (pvVar3,&local_f0);
      Variable::~Variable(&local_f0);
      Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&sz);
    }
  }
  std::
  vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
  ::clear(&__return_storage_ptr__->ths);
  local_114 = 0;
  local_118 = IStreamer::Read<unsigned_int>(stream);
  for (; local_114 < local_118; local_114 = local_114 + 1) {
    iVar2 = std::istream::get();
    if (iVar2 == 0) {
      Nullable<LiteScript::Variable>::Nullable(&local_138);
      std::
      vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
      ::push_back(&__return_storage_ptr__->ths,&local_138);
      Nullable<LiteScript::Variable>::~Nullable(&local_138);
    }
    else {
      uVar1 = IStreamer::Read<unsigned_int>(stream);
      Memory::GetVariable((Nullable<LiteScript::Variable> *)&sz_1,memory,uVar1);
      std::
      vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
      ::push_back(&__return_storage_ptr__->ths,(value_type *)&sz_1);
      Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&sz_1);
    }
  }
  std::
  vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
  ::clear(&__return_storage_ptr__->rets);
  local_15c = 0;
  local_160 = IStreamer::Read<unsigned_int>(stream);
  for (; local_15c < local_160; local_15c = local_15c + 1) {
    iVar2 = std::istream::get();
    if (iVar2 == 0) {
      Nullable<LiteScript::Variable>::Nullable(&local_180);
      std::
      vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
      ::push_back(&__return_storage_ptr__->rets,&local_180);
      Nullable<LiteScript::Variable>::~Nullable(&local_180);
    }
    else {
      uVar1 = IStreamer::Read<unsigned_int>(stream);
      Memory::GetVariable((Nullable<LiteScript::Variable> *)&sz_2,memory,uVar1);
      std::
      vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
      ::push_back(&__return_storage_ptr__->rets,(value_type *)&sz_2);
      Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&sz_2);
    }
  }
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::clear
            (&__return_storage_ptr__->op_lifo);
  local_1a4 = 0;
  local_1a8 = IStreamer::Read<unsigned_int>(stream);
  for (; local_1a4 < local_1a8; local_1a4 = local_1a4 + 1) {
    uVar1 = IStreamer::Read<unsigned_int>(stream);
    Memory::GetVariable((Nullable<LiteScript::Variable> *)&sz_3,memory,uVar1);
    Nullable::operator_cast_to_Variable((Nullable *)&local_1b8);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&__return_storage_ptr__->op_lifo,&local_1b8);
    Variable::~Variable(&local_1b8);
    Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&sz_3);
  }
  std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::clear
            (&__return_storage_ptr__->call_lifo);
  local_1dc = 0;
  local_1e0 = IStreamer::Read<unsigned_int>(stream);
  for (; local_1dc < local_1e0; local_1dc = local_1dc + 1) {
    sz_4 = IStreamer::Read<unsigned_int>(stream);
    i_6 = IStreamer::Read<unsigned_int>(stream);
    std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    push_back(&__return_storage_ptr__->call_lifo,(value_type *)&sz_4);
  }
  std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::clear
            (&__return_storage_ptr__->nsp_lifo);
  local_1ec = 0;
  local_1f0 = IStreamer::Read<unsigned_int>(stream);
  for (; local_1ec < local_1f0; local_1ec = local_1ec + 1) {
    Namer::Namer(&local_238,&__return_storage_ptr__->nsp_global);
    std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::push_back
              (&__return_storage_ptr__->nsp_lifo,&local_238);
    Namer::~Namer(&local_238);
    this = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::operator[]
                     (&__return_storage_ptr__->nsp_lifo,(ulong)local_1ec);
    Namer::LoadIDs(this,stream);
  }
  std::allocator<LiteScript::Variable>::~allocator(local_35);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::State LiteScript::State::Load(std::istream &stream, Memory &memory) {
    State state(memory);
    state.instr_index = IStreamer::Read<unsigned int>(stream);
    state.line_num = IStreamer::Read<unsigned int>(stream);
    std::allocator<Variable> allocator;
    allocator.destroy(&state.nsp_global);
    allocator.construct(&state.nsp_global, memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    state.args_tmp.clear();
    for (unsigned int i = 0, sz_i = IStreamer::Read<unsigned int>(stream); i < sz_i; i++) {
        state.args_tmp.push_back(std::vector<Variable>());
        for (unsigned int j = 0, sz_j = IStreamer::Read<unsigned int>(stream); j < sz_j; j++)
            state.args_tmp[i].push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    }
    state.args_tmp.clear();
    for (unsigned int i = 0, sz_i = IStreamer::Read<unsigned int>(stream); i < sz_i; i++) {
        state.args_def.push_back(std::vector<Variable>());
        for (unsigned int j = 0, sz_j = IStreamer::Read<unsigned int>(stream); j < sz_j; j++)
            state.args_def[i].push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    }
    state.ths.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        if (stream.get() == 0)
            state.ths.push_back(Nullable<Variable>());
        else
            state.ths.push_back(Nullable<Variable>(memory.GetVariable(IStreamer::Read<unsigned int>(stream))));
    }
    state.rets.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        if (stream.get() == 0)
            state.rets.push_back(Nullable<Variable>());
        else
            state.rets.push_back(Nullable<Variable>(memory.GetVariable(IStreamer::Read<unsigned int>(stream))));
    }
    state.op_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++)
        state.op_lifo.push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    state.call_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++)
        state.call_lifo.push_back({ IStreamer::Read<unsigned int>(stream), IStreamer::Read<unsigned int>(stream) });
    state.nsp_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        state.nsp_lifo.push_back(Namer(state.nsp_global));
        state.nsp_lifo[i].LoadIDs(stream);
    }
    return state;
}